

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

void __thiscall S2Builder::Init(S2Builder *this,Options *options)

{
  _Head_base<0UL,_S2Builder::SnapFunction_*,_false> this_00;
  S1Angle angle;
  S1ChordAngle dist;
  S1ChordAngle SVar1;
  double extraout_XMM0_Qa;
  double dVar2;
  double dVar3;
  S1Angle SVar4;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  S1Angle angle_00;
  S1Angle angle_01;
  S2LogMessage local_38;
  double local_28;
  
  Options::operator=(&this->options_,options);
  this_00._M_head_impl =
       (options->snap_function_)._M_t.
       super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
       ._M_t.
       super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
       .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl;
  (*(this_00._M_head_impl)->_vptr_SnapFunction[2])(this_00._M_head_impl);
  if (1.2217304763960306 < angle.radians_) {
    S2LogMessage::S2LogMessage
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0xc5,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_38.stream_,"Check failed: (snap_radius) <= (SnapFunction::kMaxSnapRadius()) ",
               0x40);
  }
  else {
    S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_38,angle);
    (this->site_snap_radius_ca_).length2_ = (double)local_38._0_8_;
    if (options->split_crossing_edges_ == false) {
      (this->edge_snap_radius_ca_).length2_ = (double)local_38._0_8_;
      dist.length2_ = angle.radians_;
    }
    else {
      dist.length2_ = angle.radians_ + 8.881784197001252e-16;
      SVar1 = RoundUp(dist.length2_);
      (this->edge_snap_radius_ca_).length2_ = SVar1.length2_;
    }
    this->snapping_requested_ = 0.0 < dist.length2_;
    local_28 = (double)SnapFunction::max_edge_deviation(this_00._M_head_impl);
    (this->max_edge_deviation_).radians_ = local_28;
    (*(this_00._M_head_impl)->_vptr_SnapFunction[4])(this_00._M_head_impl);
    S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_38,(S1Angle)(extraout_XMM0_Qa + local_28));
    (this->edge_site_query_radius_ca_).length2_ = (double)local_38._0_8_;
    dVar2 = sin(angle.radians_);
    dVar3 = sin((this->max_edge_deviation_).radians_);
    dVar2 = acos(dVar2 / dVar3);
    S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_38,(S1Angle)(dVar2 + dVar2));
    (this->min_edge_length_to_split_ca_).length2_ = (double)local_38._0_8_;
    SVar4 = SnapFunction::max_edge_deviation(this_00._M_head_impl);
    (*(this_00._M_head_impl)->_vptr_SnapFunction[2])(this_00._M_head_impl);
    local_28 = extraout_XMM0_Qa_00;
    (*(this_00._M_head_impl)->_vptr_SnapFunction[4])(this_00._M_head_impl);
    if (SVar4.radians_ <= extraout_XMM0_Qa_01 + local_28) {
      (*(this_00._M_head_impl)->_vptr_SnapFunction[3])(this_00._M_head_impl);
      (this->min_site_separation_).radians_ = angle_00.radians_;
      S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_38,angle_00);
      (this->min_site_separation_ca_).length2_ = (double)local_38._0_8_;
      (*(this_00._M_head_impl)->_vptr_SnapFunction[4])(this_00._M_head_impl);
      S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_38,angle_01);
      (this->min_edge_site_separation_ca_).length2_ = (double)local_38._0_8_;
      dVar2 = S2::GetUpdateMinDistanceMaxError(dist);
      SVar1 = S1ChordAngle::PlusError((S1ChordAngle *)&local_38,dVar2);
      (this->min_edge_site_separation_ca_limit_).length2_ = SVar1.length2_;
      local_38._0_8_ = RoundUp((S1Angle)(dist.length2_ + dist.length2_));
      dVar2 = S1ChordAngle::GetS2PointConstructorMaxError((S1ChordAngle *)&local_38);
      SVar1 = S1ChordAngle::PlusError((S1ChordAngle *)&local_38,dVar2);
      (this->max_adjacent_site_separation_ca_).length2_ = SVar1.length2_;
      dVar2 = sin(dist.length2_);
      this->edge_snap_radius_sin2_ =
           ((dVar2 * 9.5 + 2.5 + 3.4641016151377544) * dVar2 + 1.9984014443252818e-15) *
           2.220446049250313e-16 + dVar2 * dVar2;
      this->label_set_id_ = -0x80000000;
      this->snapping_needed_ = false;
      this->label_set_modified_ = false;
      return;
    }
    S2LogMessage::S2LogMessage
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0xf5,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_38.stream_,
               "Check failed: (snap_function.max_edge_deviation()) <= (snap_function.snap_radius() + snap_function.min_edge_vertex_separation()) "
               ,0x81);
  }
  abort();
}

Assistant:

void S2Builder::Init(const Options& options) {
  options_ = options;
  const SnapFunction& snap_function = options.snap_function();
  S1Angle snap_radius = snap_function.snap_radius();
  S2_DCHECK_LE(snap_radius, SnapFunction::kMaxSnapRadius());

  // Convert the snap radius to an S1ChordAngle.  This is the "true snap
  // radius" used when evaluating exact predicates (s2predicates.h).
  site_snap_radius_ca_ = S1ChordAngle(snap_radius);

  // When split_crossing_edges() is true, we need to use a larger snap radius
  // for edges than for vertices to ensure that both edges are snapped to the
  // edge intersection location.  This is because the computed intersection
  // point is not exact; it may be up to kIntersectionError away from its true
  // position.  The computed intersection point might then be snapped to some
  // other vertex up to snap_radius away.  So to ensure that both edges are
  // snapped to a common vertex, we need to increase the snap radius for edges
  // to at least the sum of these two values (calculated conservatively).
  S1Angle edge_snap_radius = snap_radius;
  if (!options.split_crossing_edges()) {
    edge_snap_radius_ca_ = site_snap_radius_ca_;
  } else {
    edge_snap_radius += S2::kIntersectionError;
    edge_snap_radius_ca_ = RoundUp(edge_snap_radius);
  }
  snapping_requested_ = (edge_snap_radius > S1Angle::Zero());

  // Compute the maximum distance that a vertex can be separated from an
  // edge while still affecting how that edge is snapped.
  max_edge_deviation_ = snap_function.max_edge_deviation();
  edge_site_query_radius_ca_ = S1ChordAngle(
      max_edge_deviation_ + snap_function.min_edge_vertex_separation());

  // Compute the maximum edge length such that even if both endpoints move by
  // the maximum distance allowed (i.e., snap_radius), the center of the edge
  // will still move by less than max_edge_deviation().  This saves us a lot
  // of work since then we don't need to check the actual deviation.
  min_edge_length_to_split_ca_ = S1ChordAngle::Radians(
      2 * acos(sin(snap_radius) / sin(max_edge_deviation_)));

  // If the condition below is violated, then AddExtraSites() needs to be
  // modified to check that snapped edges pass on the same side of each "site
  // to avoid" as the input edge.  Currently it doesn't need to do this
  // because the condition below guarantees that if the snapped edge passes on
  // the wrong side of the site then it is also too close, which will cause a
  // separation site to be added.
  //
  // Currently max_edge_deviation() is at most 1.1 * snap_radius(), whereas
  // min_edge_vertex_separation() is at least 0.219 * snap_radius() (based on
  // S2CellIdSnapFunction, which is currently the worst case).
  S2_DCHECK_LE(snap_function.max_edge_deviation(),
            snap_function.snap_radius() +
            snap_function.min_edge_vertex_separation());

  // To implement idempotency, we check whether the input geometry could
  // possibly be the output of a previous S2Builder invocation.  This involves
  // testing whether any site/site or edge/site pairs are too close together.
  // This is done using exact predicates, which require converting the minimum
  // separation values to an S1ChordAngle.
  min_site_separation_ = snap_function.min_vertex_separation();
  min_site_separation_ca_ = S1ChordAngle(min_site_separation_);
  min_edge_site_separation_ca_ =
      S1ChordAngle(snap_function.min_edge_vertex_separation());

  // This is an upper bound on the distance computed by S2ClosestPointQuery
  // where the true distance might be less than min_edge_site_separation_ca_.
  min_edge_site_separation_ca_limit_ =
      AddPointToEdgeError(min_edge_site_separation_ca_);

  // Compute the maximum possible distance between two sites whose Voronoi
  // regions touch.  (The maximum radius of each Voronoi region is
  // edge_snap_radius_.)  Then increase this bound to account for errors.
  max_adjacent_site_separation_ca_ =
      AddPointToPointError(RoundUp(2 * edge_snap_radius));

  // Finally, we also precompute sin^2(edge_snap_radius), which is simply the
  // squared distance between a vertex and an edge measured perpendicular to
  // the plane containing the edge, and increase this value by the maximum
  // error in the calculation to compare this distance against the bound.
  double d = sin(edge_snap_radius);
  edge_snap_radius_sin2_ = d * d;
  edge_snap_radius_sin2_ += ((9.5 * d + 2.5 + 2 * sqrt(3)) * d +
                             9 * DBL_EPSILON) * DBL_EPSILON;

  // Initialize the current label set.
  label_set_id_ = label_set_lexicon_.EmptySetId();
  label_set_modified_ = false;

  // If snapping was requested, we try to determine whether the input geometry
  // already meets the output requirements.  This is necessary for
  // idempotency, and can also save work.  If we discover any reason that the
  // input geometry needs to be modified, snapping_needed_ is set to true.
  snapping_needed_ = false;
}